

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  cmMakefile *pcVar1;
  int iVar2;
  char *pcVar3;
  char *local_300;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  char *local_1d0;
  char *value;
  ostringstream local_198 [8];
  ostringstream ostr;
  char *var_local;
  cmCommandArgumentParserHelper *this_local;
  
  if (var == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)0x0;
  }
  else if ((this->FileLine < 0) || (iVar2 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar2 != 0)) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,var,&local_1f1);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    local_1d0 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,var,&local_219);
      cmMakefile::MaybeWarnUninitialized(pcVar1,&local_218,this->FileName);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      if ((this->RemoveEmpty & 1U) == 0) {
        return (char *)0x0;
      }
    }
    pcVar3 = local_1d0;
    if (((this->EscapeQuotes & 1U) == 0) || (local_1d0 == (char *)0x0)) {
      if (local_1d0 == (char *)0x0) {
        local_300 = "";
      }
      else {
        local_300 = local_1d0;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,local_300,&local_289);
      this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator(&local_289);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,pcVar3,&local_261);
      cmSystemTools::EscapeQuotes(&local_240,&local_260);
      this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator(&local_261);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::ostream::operator<<(local_198,this->FileLine);
    std::__cxx11::ostringstream::str();
    this_local = (cmCommandArgumentParserHelper *)AddString(this,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return (char *)this_local;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return nullptr;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
  }
  const char* value = this->Makefile->GetDefinition(var);
  if (!value) {
    this->Makefile->MaybeWarnUninitialized(var, this->FileName);
    if (!this->RemoveEmpty) {
      return nullptr;
    }
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
  }
  return this->AddString(value ? value : "");
}